

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::IntersectClauseSyntax::setChild
          (IntersectClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  long in_RSI;
  long in_RDI;
  Token TVar2;
  ConstTokenOrSyntax *in_stack_ffffffffffffffb8;
  RangeListSyntax *local_30;
  not_null<slang::syntax::RangeListSyntax_*> local_28;
  undefined8 local_20;
  Info *local_18;
  
  if (in_RSI == 0) {
    TVar2 = ConstTokenOrSyntax::token(in_stack_ffffffffffffffb8);
    local_20 = TVar2._0_8_;
    *(undefined8 *)(in_RDI + 0x18) = local_20;
    local_18 = TVar2.info;
    *(Info **)(in_RDI + 0x20) = local_18;
  }
  else {
    pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4fcbda);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_30 = (RangeListSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node((TokenOrSyntax *)0x4fcbea);
      local_30 = SyntaxNode::as<slang::syntax::RangeListSyntax>(pSVar1);
    }
    not_null<slang::syntax::RangeListSyntax_*>::not_null<slang::syntax::RangeListSyntax_*>
              (&local_28,&local_30);
    *(RangeListSyntax **)(in_RDI + 0x28) = local_28.ptr;
  }
  return;
}

Assistant:

void IntersectClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: intersect = child.token(); return;
        case 1: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}